

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O0

void info_print_module(lyout *out,lys_module *module)

{
  char *pcVar1;
  lys_module *module_local;
  lyout *out_local;
  
  ly_print(out,"%-*s%s\n",0xb,"Module: ",module->name);
  ly_print(out,"%-*s%s\n",0xb,"Namespace: ",module->ns);
  ly_print(out,"%-*s%s\n",0xb,"Prefix: ",module->prefix);
  info_print_text(out,module->dsc,"Desc: ");
  info_print_text(out,module->ref,"Reference: ");
  info_print_text(out,module->org,"Org: ");
  info_print_text(out,module->contact,"Contact: ");
  pcVar1 = "1.0";
  if (((byte)module->field_0x40 >> 1 & 7) == 2) {
    pcVar1 = "1.1";
  }
  ly_print(out,"%-*s%s\n",0xb,"YANG ver: ",pcVar1);
  pcVar1 = "no";
  if (((byte)module->field_0x40 >> 4 & 3) != 0) {
    pcVar1 = "yes";
  }
  ly_print(out,"%-*s%s\n",0xb,"Deviated: ",pcVar1);
  pcVar1 = "no";
  if ((char)module->field_0x40 < '\0') {
    pcVar1 = "yes";
  }
  ly_print(out,"%-*s%s\n",0xb,"Implement: ",pcVar1);
  info_print_text(out,module->filepath,"URI: file://");
  info_print_revision(out,module->rev,module->rev_size);
  info_print_include(out,module);
  info_print_import_with_include(out,module);
  info_print_typedef_with_include(out,module);
  info_print_ident_with_include(out,module);
  info_print_features_with_include(out,module);
  info_print_augment(out,module);
  info_print_deviation(out,module);
  info_print_data_with_include(out,module);
  return;
}

Assistant:

static void
info_print_module(struct lyout *out, const struct lys_module *module)
{
    ly_print(out, "%-*s%s\n", INDENT_LEN, "Module: ", module->name);
    ly_print(out, "%-*s%s\n", INDENT_LEN, "Namespace: ", module->ns);
    ly_print(out, "%-*s%s\n", INDENT_LEN, "Prefix: ", module->prefix);
    info_print_text(out, module->dsc, "Desc: ");
    info_print_text(out, module->ref, "Reference: ");
    info_print_text(out, module->org, "Org: ");
    info_print_text(out, module->contact, "Contact: ");
    ly_print(out, "%-*s%s\n", INDENT_LEN, "YANG ver: ", (module->version == 2 ? "1.1" : "1.0"));
    ly_print(out, "%-*s%s\n", INDENT_LEN, "Deviated: ", (module->deviated ? "yes" : "no"));
    ly_print(out, "%-*s%s\n", INDENT_LEN, "Implement: ", (module->implemented ? "yes" : "no"));
    info_print_text(out, module->filepath, "URI: file://");

    info_print_revision(out, module->rev, module->rev_size);
    info_print_include(out, module);
    info_print_import_with_include(out, module);
    info_print_typedef_with_include(out, module);
    info_print_ident_with_include(out, module);
    info_print_features_with_include(out, module);
    info_print_augment(out, module);
    info_print_deviation(out, module);

    info_print_data_with_include(out, module);
}